

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<const_DomActionGroup_*,_QString>::emplace_helper<QString>
          (QHash<const_DomActionGroup_*,_QString> *this,DomActionGroup **key,QString *args)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  piter pVar4;
  Node<const_DomActionGroup_*,_QString> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<DomActionGroup_const*,QString>>::
  findOrInsert<DomActionGroup_const*>
            ((InsertionResult *)local_38,
             (Data<QHashPrivate::Node<DomActionGroup_const*,QString>> *)this->d,key);
  this_00 = (Node<const_DomActionGroup_*,_QString> *)
            ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
            (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    this_00->key = *key;
    pDVar1 = (args->d).d;
    (args->d).d = (Data *)0x0;
    (this_00->value).d.d = pDVar1;
    pcVar2 = (args->d).ptr;
    (args->d).ptr = (char16_t *)0x0;
    (this_00->value).d.ptr = pcVar2;
    qVar3 = (args->d).size;
    (args->d).size = 0;
    (this_00->value).d.size = qVar3;
  }
  else {
    QHashPrivate::Node<const_DomActionGroup_*,_QString>::emplaceValue<QString>(this_00,args);
  }
  pVar4.bucket = local_38._8_8_;
  pVar4.d = (Data<QHashPrivate::Node<const_DomActionGroup_*,_QString>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar4;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }